

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O1

QString * __thiscall QSslError::errorString(QString *__return_storage_ptr__,QSslError *this)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 uStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(((this->d)._M_t.
          super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>._M_t.
          super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>.
          super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl)->error) {
  case NoError:
    iVar4 = 0x2828a3;
    break;
  case UnableToGetIssuerCertificate:
    iVar4 = 0x283004;
    break;
  case UnableToDecryptCertificateSignature:
    iVar4 = 0x28302e;
    break;
  case UnableToDecodeIssuerPublicKey:
    iVar4 = 0x28305f;
    break;
  case CertificateSignatureFailed:
    iVar4 = 0x283093;
    break;
  case CertificateNotYetValid:
    iVar4 = 0x2830bf;
    break;
  case CertificateExpired:
    iVar4 = 0x2830e0;
    break;
  case InvalidNotBeforeField:
    iVar4 = 0x2830fc;
    break;
  case InvalidNotAfterField:
    iVar4 = 0x283137;
    break;
  case SelfSignedCertificate:
    iVar4 = 0x283171;
    break;
  case SelfSignedCertificateInChain:
    iVar4 = 0x28319f;
    break;
  case UnableToGetLocalIssuerCertificate:
    iVar4 = 0x2831eb;
    break;
  case UnableToVerifyFirstCertificate:
    iVar4 = 0x283238;
    break;
  default:
    iVar4 = 0x262d74;
    break;
  case InvalidCaCertificate:
    iVar4 = 0x28325a;
    break;
  case PathLengthExceeded:
    iVar4 = 0x283280;
    break;
  case InvalidPurpose:
    iVar4 = 0x2832bd;
    break;
  case CertificateUntrusted:
    iVar4 = 0x2832f5;
    break;
  case CertificateRejected:
    iVar4 = 0x28332d;
    break;
  case SubjectIssuerMismatch:
    iVar4 = 0x28336f;
    break;
  case AuthorityIssuerSerialNumberMismatch:
    iVar4 = 0x2833f7;
    break;
  case NoPeerCertificate:
    iVar4 = 0x2834ad;
    break;
  case HostNameMismatch:
    iVar4 = 0x2834d6;
    break;
  case NoSslSupport:
    goto switchD_0024d209_caseD_17;
  case CertificateBlacklisted:
    iVar4 = 0x28351e;
    break;
  case OcspNoResponseFound:
    iVar4 = 0x283542;
    break;
  case OcspMalformedRequest:
    iVar4 = 0x283560;
    break;
  case OcspMalformedResponse:
    iVar4 = 0x28358b;
    break;
  case OcspInternalError:
    iVar4 = 0x2835d4;
    break;
  case OcspTryLater:
    iVar4 = 0x28360a;
    break;
  case OcspSigRequred:
    iVar4 = 0x283655;
    break;
  case OcspUnauthorized:
    iVar4 = 0x2836ae;
    break;
  case OcspResponseCannotBeTrusted:
    iVar4 = 0x2836f3;
    break;
  case OcspResponseCertIdUnknown:
    iVar4 = 0x283720;
    break;
  case OcspResponseExpired:
    iVar4 = 0x283768;
    break;
  case OcspStatusUnknown:
    iVar4 = 0x283794;
  }
  QMetaObject::tr((char *)&local_38,(char *)&QSslSocket::staticMetaObject,iVar4);
  pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
  pcVar2 = (__return_storage_ptr__->d).ptr;
  *(undefined4 *)&(__return_storage_ptr__->d).d = (undefined4)local_38;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = (undefined4)uStack_30;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_30._4_4_;
  qVar3 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_28;
  local_38 = pQVar1;
  uStack_30 = pcVar2;
  local_28 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
switchD_0024d209_caseD_17:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslError::errorString() const
{
    QString errStr;
    switch (d->error) {
    case NoError:
        errStr = QSslSocket::tr("No error");
        break;
    case UnableToGetIssuerCertificate:
        errStr = QSslSocket::tr("The issuer certificate could not be found");
        break;
    case UnableToDecryptCertificateSignature:
        errStr = QSslSocket::tr("The certificate signature could not be decrypted");
        break;
    case UnableToDecodeIssuerPublicKey:
        errStr = QSslSocket::tr("The public key in the certificate could not be read");
        break;
    case CertificateSignatureFailed:
        errStr = QSslSocket::tr("The signature of the certificate is invalid");
        break;
    case CertificateNotYetValid:
        errStr = QSslSocket::tr("The certificate is not yet valid");
        break;
    case CertificateExpired:
        errStr = QSslSocket::tr("The certificate has expired");
        break;
    case InvalidNotBeforeField:
        errStr = QSslSocket::tr("The certificate's notBefore field contains an invalid time");
        break;
    case InvalidNotAfterField:
        errStr = QSslSocket::tr("The certificate's notAfter field contains an invalid time");
        break;
    case SelfSignedCertificate:
        errStr = QSslSocket::tr("The certificate is self-signed, and untrusted");
        break;
    case SelfSignedCertificateInChain:
        errStr = QSslSocket::tr("The root certificate of the certificate chain is self-signed, and untrusted");
        break;
    case UnableToGetLocalIssuerCertificate:
        errStr = QSslSocket::tr("The issuer certificate of a locally looked up certificate could not be found");
        break;
    case UnableToVerifyFirstCertificate:
        errStr = QSslSocket::tr("No certificates could be verified");
        break;
    case InvalidCaCertificate:
        errStr = QSslSocket::tr("One of the CA certificates is invalid");
        break;
    case PathLengthExceeded:
        errStr = QSslSocket::tr("The basicConstraints path length parameter has been exceeded");
        break;
    case InvalidPurpose:
        errStr = QSslSocket::tr("The supplied certificate is unsuitable for this purpose");
        break;
    case CertificateUntrusted:
        errStr = QSslSocket::tr("The root CA certificate is not trusted for this purpose");
        break;
    case CertificateRejected:
        errStr = QSslSocket::tr("The root CA certificate is marked to reject the specified purpose");
        break;
    case SubjectIssuerMismatch: // hostname mismatch
        errStr = QSslSocket::tr("The current candidate issuer certificate was rejected because its"
                                " subject name did not match the issuer name of the current certificate");
        break;
    case AuthorityIssuerSerialNumberMismatch:
        errStr = QSslSocket::tr("The current candidate issuer certificate was rejected because"
                             " its issuer name and serial number was present and did not match the"
                             " authority key identifier of the current certificate");
        break;
    case NoPeerCertificate:
        errStr = QSslSocket::tr("The peer did not present any certificate");
        break;
    case HostNameMismatch:
        errStr = QSslSocket::tr("The host name did not match any of the valid hosts"
                             " for this certificate");
        break;
    case NoSslSupport:
        break;
    case CertificateBlacklisted:
        errStr = QSslSocket::tr("The peer certificate is blacklisted");
        break;
    case OcspNoResponseFound:
        errStr = QSslSocket::tr("No OCSP status response found");
        break;
    case OcspMalformedRequest:
        errStr = QSslSocket::tr("The OCSP status request had invalid syntax");
        break;
    case OcspMalformedResponse:
        errStr = QSslSocket::tr("OCSP response contains an unexpected number of SingleResponse structures");
        break;
    case OcspInternalError:
        errStr = QSslSocket::tr("OCSP responder reached an inconsistent internal state");
        break;
    case OcspTryLater:
        errStr = QSslSocket::tr("OCSP responder was unable to return a status for the requested certificate");
        break;
    case OcspSigRequred:
        errStr = QSslSocket::tr("The server requires the client to sign the OCSP request in order to construct a response");
        break;
    case OcspUnauthorized:
        errStr = QSslSocket::tr("The client is not authorized to request OCSP status from this server");
        break;
    case OcspResponseCannotBeTrusted:
        errStr = QSslSocket::tr("OCSP responder's identity cannot be verified");
        break;
    case OcspResponseCertIdUnknown:
        errStr = QSslSocket::tr("The identity of a certificate in an OCSP response cannot be established");
        break;
    case OcspResponseExpired:
        errStr = QSslSocket::tr("The certificate status response has expired");
        break;
    case OcspStatusUnknown:
        errStr = QSslSocket::tr("The certificate's status is unknown");
        break;
    default:
        errStr = QSslSocket::tr("Unknown error");
        break;
    }

    return errStr;
}